

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::setTilesGraphic(Fifteen *this)

{
  pointer puVar1;
  size_type sVar2;
  QPushButton *pQVar3;
  NumberColor numberColor;
  uint uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  vector<QImage,_std::allocator<QImage>_> *this_00;
  size_t sVar6;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *pvVar7;
  const_reference pvVar8;
  Fifteen *this_01;
  pointer puVar9;
  size_type *psVar10;
  QIcon icon;
  QSize iconSize;
  QArrayDataPointer<char16_t> local_70;
  QPixmap pixmap;
  
  Controller::getBoardAttributes((Controller *)&stack0xffffffffffffffc0);
  pvVar5 = Controller::getValues
                     ((this->controller)._M_t.
                      super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                      super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                      super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  psVar10 = (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = Controller::getImages
                      ((this->controller)._M_t.
                       super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                       super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                       super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  sVar6 = Controller::getFontSize
                    ((this->controller)._M_t.
                     super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                     super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                     super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  numberColor = Options::getNumberOnImageColor();
  QIcon::QIcon(&icon);
  pvVar7 = TilesBoard::getTiles
                     ((this->tilesBoard)._M_t.
                      super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                      super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                      super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  puVar9 = (pvVar7->
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pvVar7->
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar9 == puVar1) {
      QIcon::~QIcon(&icon);
      return;
    }
    pvVar8 = std::vector<QImage,_std::allocator<QImage>_>::at(this_00,*psVar10);
    QPixmap::fromImage(&pixmap,pvVar8,0);
    if (numberColor == NO) {
LAB_0010b4dc:
      QIcon::addPixmap(&icon,&pixmap,0,1);
    }
    else {
      sVar2 = *psVar10;
      this_01 = (Fifteen *)
                (this->controller)._M_t.
                super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                super__Head_base<0UL,_Controller_*,_false>._M_head_impl;
      uVar4 = Controller::getNullValue((Controller *)this_01);
      if (sVar2 == uVar4) goto LAB_0010b4dc;
      drawNumberOnTile(this_01,&icon,&pixmap,(long)(int)sVar6,*psVar10,numberColor);
    }
    QAbstractButton::setIconSize
              ((QSize *)(puVar9->_M_t).
                        super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
                        super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                        super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
    QAbstractButton::setIcon
              ((QIcon *)(puVar9->_M_t).
                        super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
                        super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                        super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
    pQVar3 = (puVar9->_M_t).super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
             _M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
             super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl;
    QString::QString((QString *)&local_70,"");
    QWidget::setStyleSheet((QString *)pQVar3);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    psVar10 = psVar10 + 1;
    QPixmap::~QPixmap(&pixmap);
    puVar9 = puVar9 + 1;
  } while( true );
}

Assistant:

void Fifteen::setTilesGraphic()
{
    const auto [ boardSizeInt, tileSizeInt ] = controller->getBoardAttributes();
    auto value = controller->getValues().begin();

    const auto& images = controller->getImages();
    QSize iconSize( tileSizeInt, tileSizeInt );

    int fontSizeInt = controller->getFontSize();
    NumberColor numberColor = Options::getNumberOnImageColor();
    QIcon icon;

    for ( auto& tile : tilesBoard->getTiles() )
    {
        QPixmap pixmap = QPixmap::fromImage( images.at( *value ));
        if ( numberColor == NumberColor::NO || *value == controller->getNullValue() )
        {
            icon.addPixmap( pixmap );
        }
        else
        {
            drawNumberOnTile( icon, pixmap, fontSizeInt, *value, numberColor );
        }
        tile->setIconSize( iconSize );
        tile->setIcon( icon );
        tile->setStyleSheet( "" );
        value++;
    }
}